

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O2

uint64_t WABT_BYTES_TO_MIN_PAGES(uint64_t num_bytes,uint32_t page_size)

{
  ulong uVar1;
  
  if (page_size - 1 < (page_size ^ page_size - 1)) {
    uVar1 = num_bytes / page_size;
    return uVar1 + (page_size * uVar1 - num_bytes != 0);
  }
  abort();
}

Assistant:

inline uint64_t WABT_BYTES_TO_MIN_PAGES(uint64_t num_bytes,
                                        uint32_t page_size) {
  if ((page_size == 0) ||
      (page_size & (page_size - 1))) {  // malformed page sizes
    WABT_UNREACHABLE;
    return 0;
  }
  uint64_t num_pages = num_bytes / page_size;
  return (page_size * num_pages == num_bytes) ? num_pages : num_pages + 1;
}